

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hpp
# Opt level: O2

shared_ptr<spdlog::logger> njoy::tools::Log::initialize_logger(void)

{
  logger *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  allocator<char> local_51;
  string local_50 [32];
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>(local_50,"njoy",&local_51);
  spdlog::stdout_color_st<spdlog::synchronous_factory>((string *)in_RDI,(color_mode)local_50);
  std::__cxx11::string::~string(local_50);
  this = (logger *)((_Alloc_hider *)&in_RDI->_vptr_logger)->_M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"[%^%l%$] %v",(allocator<char> *)local_50);
  spdlog::logger::set_pattern(this,&local_30,local);
  std::__cxx11::string::~string((string *)&local_30);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto initialize_logger() {

    auto instance = spdlog::stdout_color_st( "njoy" );
    instance->set_pattern( "[%^%l%$] %v" );
    #ifndef NDEBUG
    instance->set_level( spdlog::level::debug );
    #endif
    return instance;
  }